

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O2

void __thiscall QWidgetAction::releaseWidget(QWidgetAction *this,QWidget *widget)

{
  Function slot;
  bool bVar1;
  QWidget *pQVar2;
  long in_FS_OFFSET;
  QWidget *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  slot = *(Function *)&this->field_0x8;
  local_30 = widget;
  if (*(long *)(slot + 0x1a8) != 0) {
    if (*(int *)(*(long *)(slot + 0x1a8) + 4) == 0) {
      pQVar2 = (QWidget *)0x0;
    }
    else {
      pQVar2 = *(QWidget **)(slot + 0x1b0);
    }
    if (pQVar2 == widget) {
      QWidget::hide(*(QWidget **)(slot + 0x1b0));
      QWidget::setParent(*(QWidget **)(slot + 0x1b0),(QWidget *)0x0);
      *(byte *)(slot + 0x1d0) = *(byte *)(slot + 0x1d0) & 0xfe;
      goto LAB_00379da0;
    }
  }
  bVar1 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                    ((QListSpecialMethodsBase<QWidget*> *)(slot + 0x1b8),&local_30);
  if (bVar1) {
    QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QWidgetActionPrivate::*)(QObject*)>
              (&local_30->super_QObject,(offset_in_QObject_to_subr)QObject::destroyed,(Object *)0x0,
               slot);
    QtPrivate::sequential_erase_with_copy<QList<QWidget*>,QWidget*>
              ((QList<QWidget_*> *)(slot + 0x1b8),&local_30);
    (**(code **)(*(long *)this + 0x68))(this,local_30);
  }
LAB_00379da0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetAction::releaseWidget(QWidget *widget)
{
    Q_D(QWidgetAction);

    if (widget == d->defaultWidget) {
        d->defaultWidget->hide();
        d->defaultWidget->setParent(nullptr);
        d->defaultWidgetInUse = false;
        return;
    }

    if (!d->createdWidgets.contains(widget))
        return;

    QObjectPrivate::disconnect(widget, &QWidget::destroyed,
                               d, &QWidgetActionPrivate::widgetDestroyed);
    d->createdWidgets.removeAll(widget);
    deleteWidget(widget);
}